

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

Ptr<Catch::IStreamingReporter> __thiscall
Catch::makeReporter(Catch *this,Ptr<Catch::Config> *config)

{
  pointer pbVar1;
  undefined1 reporterName [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  reporters;
  allocator local_38 [8];
  
  reporters.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)config;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_58,&(config->m_p->m_data).reporterNames);
  pbVar1 = reporters.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  reporterName = local_58;
  if (local_58 ==
      (undefined1  [8])
      reporters.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    std::__cxx11::string::string((string *)&local_78,"console",local_38);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_58,
               &local_78);
    std::__cxx11::string::~string((string *)&local_78);
    pbVar1 = reporters.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    reporterName = local_58;
  }
  *(undefined8 *)this = 0;
  for (; reporterName != (undefined1  [8])pbVar1;
      reporterName = (undefined1  [8])((long)reporterName + 0x20)) {
    createReporter((Catch *)local_38,(string *)reporterName,
                   (Ptr<Catch::Config> *)
                   reporters.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    addReporter((Catch *)&local_78,(Ptr<Catch::IStreamingReporter> *)this,
                (Ptr<Catch::IStreamingReporter> *)local_38);
    Ptr<Catch::IStreamingReporter>::operator=
              ((Ptr<Catch::IStreamingReporter> *)this,(Ptr<Catch::IStreamingReporter> *)&local_78);
    Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)&local_78);
    Ptr<Catch::IStreamingReporter>::~Ptr((Ptr<Catch::IStreamingReporter> *)local_38);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_58);
  return (Ptr<Catch::IStreamingReporter>)(IStreamingReporter *)this;
}

Assistant:

Ptr<IStreamingReporter> makeReporter(Ptr<Config> const& config) {
		std::vector<std::string> reporters = config->getReporterNames();
		if (reporters.empty())
			reporters.push_back("console");

		Ptr<IStreamingReporter> reporter;
		for (std::vector<std::string>::const_iterator it = reporters.begin(), itEnd = reporters.end();
			it != itEnd;
			++it)
			reporter = addReporter(reporter, createReporter(*it, config));
		return reporter;
	}